

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channeluser.c
# Opt level: O0

_Bool chirc_channeluser_get_or_create
                (chirc_channel_t *channel,chirc_user_t *user,chirc_channeluser_t **channeluser)

{
  UT_hash_handle *pUVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  chirc_channeluser_t *pcVar7;
  UT_hash_table *pUVar8;
  UT_hash_bucket *pUVar9;
  UT_hash_bucket *pUVar10;
  long *plVar11;
  uint local_10c;
  uint local_fc;
  UT_hash_bucket *_he_newbkt_1;
  UT_hash_bucket *_he_new_buckets_1;
  UT_hash_handle *_he_hh_nxt_1;
  UT_hash_handle *_he_thh_1;
  uint _he_bkt_i_1;
  uint _he_bkt_1;
  UT_hash_bucket *_ha_head_1;
  chirc_channeluser_t *pcStack_b0;
  uint _ha_bkt_1;
  uchar *_hj_key_2;
  uint _hj_k_2;
  uint _hj_j_2;
  uint _hj_i_2;
  uint _ha_hashv_1;
  UT_hash_bucket *_he_newbkt;
  UT_hash_bucket *_he_new_buckets;
  UT_hash_handle *_he_hh_nxt;
  UT_hash_handle *_he_thh;
  uint _he_bkt_i;
  uint _he_bkt;
  UT_hash_bucket *_ha_head;
  chirc_channel_t **ppcStack_60;
  uint _ha_bkt;
  uchar *_hj_key_1;
  uint local_50;
  uint _hj_k_1;
  uint _hj_j_1;
  uint _hj_i_1;
  uint _ha_hashv;
  uint _hf_bkt;
  uchar *_hj_key;
  uint local_30;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  _Bool created;
  chirc_channeluser_t **channeluser_local;
  chirc_user_t *user_local;
  chirc_channel_t *channel_local;
  
  *channeluser = (chirc_channeluser_t *)0x0;
  if (channel->users != (chirc_channeluser_t *)0x0) {
    __ha_hashv = &channeluser_local;
    _hj_j = 0xfeedbeef;
    local_30 = 0x9e3779b9;
    _hj_k = 0x9e3779b9;
    for (_hj_key._4_4_ = 8; 0xb < _hj_key._4_4_; _hj_key._4_4_ = _hj_key._4_4_ - 0xc) {
      iVar3 = (uint)*(byte *)((long)__ha_hashv + 4) + (uint)*(byte *)((long)__ha_hashv + 5) * 0x100
              + (uint)*(byte *)((long)__ha_hashv + 6) * 0x10000 +
              (uint)*(byte *)((long)__ha_hashv + 7) * 0x1000000 + local_30;
      uVar4 = (uint)*(byte *)(__ha_hashv + 1) + (uint)*(byte *)((long)__ha_hashv + 9) * 0x100 +
              (uint)*(byte *)((long)__ha_hashv + 10) * 0x10000 +
              (uint)*(byte *)((long)__ha_hashv + 0xb) * 0x1000000 + _hj_j;
      uVar5 = uVar4 >> 0xd ^
              (((uint)*(byte *)__ha_hashv + (uint)*(byte *)((long)__ha_hashv + 1) * 0x100 +
                (uint)*(byte *)((long)__ha_hashv + 2) * 0x10000 +
                (uint)*(byte *)((long)__ha_hashv + 3) * 0x1000000 + _hj_k) - iVar3) - uVar4;
      uVar6 = uVar5 << 8 ^ (iVar3 - uVar4) - uVar5;
      uVar4 = uVar6 >> 0xd ^ (uVar4 - uVar5) - uVar6;
      uVar5 = uVar4 >> 0xc ^ (uVar5 - uVar6) - uVar4;
      uVar6 = uVar5 << 0x10 ^ (uVar6 - uVar4) - uVar5;
      uVar4 = uVar6 >> 5 ^ (uVar4 - uVar5) - uVar6;
      _hj_k = uVar4 >> 3 ^ (uVar5 - uVar6) - uVar4;
      local_30 = _hj_k << 10 ^ (uVar6 - uVar4) - _hj_k;
      _hj_j = local_30 >> 0xf ^ (uVar4 - _hj_k) - local_30;
      __ha_hashv = (chirc_channeluser_t ***)((long)__ha_hashv + 0xc);
    }
    uVar4 = _hj_j + 8;
    switch(_hj_key._4_4_) {
    case 8:
      local_30 = (uint)*(byte *)((long)__ha_hashv + 4) +
                 (uint)*(byte *)((long)__ha_hashv + 5) * 0x100 +
                 (uint)*(byte *)((long)__ha_hashv + 6) * 0x10000 +
                 (uint)*(byte *)((long)__ha_hashv + 7) * 0x1000000 + local_30;
    case 4:
      _hj_k = (uint)*(byte *)__ha_hashv +
              (uint)*(byte *)((long)__ha_hashv + 1) * 0x100 +
              (uint)*(byte *)((long)__ha_hashv + 2) * 0x10000 +
              (uint)*(byte *)((long)__ha_hashv + 3) * 0x1000000 + _hj_k;
    default:
      uVar5 = uVar4 >> 0xd ^ (_hj_k - local_30) - uVar4;
      uVar6 = uVar5 << 8 ^ (local_30 - uVar4) - uVar5;
      uVar4 = uVar6 >> 0xd ^ (uVar4 - uVar5) - uVar6;
      uVar5 = uVar4 >> 0xc ^ (uVar5 - uVar6) - uVar4;
      uVar6 = uVar5 << 0x10 ^ (uVar6 - uVar4) - uVar5;
      uVar4 = uVar6 >> 5 ^ (uVar4 - uVar5) - uVar6;
      uVar5 = uVar4 >> 3 ^ (uVar5 - uVar6) - uVar4;
      uVar6 = uVar5 << 10 ^ (uVar6 - uVar4) - uVar5;
      uVar4 = uVar6 >> 0xf ^ (uVar4 - uVar5) - uVar6;
      *channeluser = (chirc_channeluser_t *)0x0;
      if (channel->users != (chirc_channeluser_t *)0x0) {
        uVar5 = uVar4 & ((channel->users->hh_from_channel).tbl)->num_buckets - 1;
        if (((channel->users->hh_from_channel).tbl)->buckets[uVar5].hh_head == (UT_hash_handle *)0x0
           ) {
          *channeluser = (chirc_channeluser_t *)0x0;
        }
        else {
          *channeluser = (chirc_channeluser_t *)
                         ((long)((channel->users->hh_from_channel).tbl)->buckets[uVar5].hh_head -
                         ((channel->users->hh_from_channel).tbl)->hho);
        }
        while ((*channeluser != (chirc_channeluser_t *)0x0 &&
               (((((*channeluser)->hh_from_channel).hashv != uVar4 ||
                 (((*channeluser)->hh_from_channel).keylen != 8)) ||
                (*((*channeluser)->hh_from_channel).key != user))))) {
          if (((*channeluser)->hh_from_channel).hh_next == (UT_hash_handle *)0x0) {
            *channeluser = (chirc_channeluser_t *)0x0;
          }
          else {
            *channeluser = (chirc_channeluser_t *)
                           ((long)((*channeluser)->hh_from_channel).hh_next -
                           ((channel->users->hh_from_channel).tbl)->hho);
          }
        }
      }
    }
  }
  if (*channeluser == (chirc_channeluser_t *)0x0) {
    _hj_i._3_1_ = true;
    channeluser_local = (chirc_channeluser_t **)user;
    user_local = (chirc_user_t *)channel;
    pcVar7 = (chirc_channeluser_t *)malloc(0x90);
    *channeluser = pcVar7;
    chirc_channeluser_init(*channeluser);
    (*channeluser)->channel = (chirc_channel_t *)user_local;
    (*channeluser)->user = (chirc_user_t *)channeluser_local;
    ppcStack_60 = &(*channeluser)->channel;
    _hj_j_1 = 0xfeedbeef;
    local_50 = 0x9e3779b9;
    _hj_k_1 = 0x9e3779b9;
    for (_hj_key_1._4_4_ = 8; 0xb < _hj_key_1._4_4_; _hj_key_1._4_4_ = _hj_key_1._4_4_ - 0xc) {
      iVar3 = (uint)*(byte *)((long)ppcStack_60 + 4) +
              (uint)*(byte *)((long)ppcStack_60 + 5) * 0x100 +
              (uint)*(byte *)((long)ppcStack_60 + 6) * 0x10000 +
              (uint)*(byte *)((long)ppcStack_60 + 7) * 0x1000000 + local_50;
      uVar4 = (uint)*(byte *)(ppcStack_60 + 1) +
              (uint)(byte)*(char *)((long)ppcStack_60 + 9) * 0x100 +
              (uint)(byte)*(char *)((long)ppcStack_60 + 10) * 0x10000 +
              (uint)(byte)*(char *)((long)ppcStack_60 + 0xb) * 0x1000000 + _hj_j_1;
      uVar5 = uVar4 >> 0xd ^
              (((uint)*(byte *)ppcStack_60 + (uint)*(byte *)((long)ppcStack_60 + 1) * 0x100 +
                (uint)*(byte *)((long)ppcStack_60 + 2) * 0x10000 +
                (uint)*(byte *)((long)ppcStack_60 + 3) * 0x1000000 + _hj_k_1) - iVar3) - uVar4;
      uVar6 = uVar5 << 8 ^ (iVar3 - uVar4) - uVar5;
      uVar4 = uVar6 >> 0xd ^ (uVar4 - uVar5) - uVar6;
      uVar5 = uVar4 >> 0xc ^ (uVar5 - uVar6) - uVar4;
      uVar6 = uVar5 << 0x10 ^ (uVar6 - uVar4) - uVar5;
      uVar4 = uVar6 >> 5 ^ (uVar4 - uVar5) - uVar6;
      _hj_k_1 = uVar4 >> 3 ^ (uVar5 - uVar6) - uVar4;
      local_50 = _hj_k_1 << 10 ^ (uVar6 - uVar4) - _hj_k_1;
      _hj_j_1 = local_50 >> 0xf ^ (uVar4 - _hj_k_1) - local_50;
      ppcStack_60 = (chirc_channel_t **)((long)ppcStack_60 + 0xc);
    }
    uVar4 = _hj_j_1 + 8;
    switch(_hj_key_1._4_4_) {
    case 8:
      local_50 = (uint)*(byte *)((long)ppcStack_60 + 4) +
                 (uint)*(byte *)((long)ppcStack_60 + 5) * 0x100 +
                 (uint)*(byte *)((long)ppcStack_60 + 6) * 0x10000 +
                 (uint)*(byte *)((long)ppcStack_60 + 7) * 0x1000000 + local_50;
    case 4:
      _hj_k_1 = (uint)*(byte *)ppcStack_60 +
                (uint)*(byte *)((long)ppcStack_60 + 1) * 0x100 +
                (uint)*(byte *)((long)ppcStack_60 + 2) * 0x10000 +
                (uint)*(byte *)((long)ppcStack_60 + 3) * 0x1000000 + _hj_k_1;
    }
    uVar5 = uVar4 >> 0xd ^ (_hj_k_1 - local_50) - uVar4;
    uVar6 = uVar5 << 8 ^ (local_50 - uVar4) - uVar5;
    uVar4 = uVar6 >> 0xd ^ (uVar4 - uVar5) - uVar6;
    uVar5 = uVar4 >> 0xc ^ (uVar5 - uVar6) - uVar4;
    uVar6 = uVar5 << 0x10 ^ (uVar6 - uVar4) - uVar5;
    uVar4 = uVar6 >> 5 ^ (uVar4 - uVar5) - uVar6;
    uVar5 = uVar4 >> 3 ^ (uVar5 - uVar6) - uVar4;
    uVar6 = uVar5 << 10 ^ (uVar6 - uVar4) - uVar5;
    uVar4 = uVar6 >> 0xf ^ (uVar4 - uVar5) - uVar6;
    ((*channeluser)->hh_from_user).hashv = uVar4;
    ((*channeluser)->hh_from_user).key = &(*channeluser)->channel;
    ((*channeluser)->hh_from_user).keylen = 8;
    if (channeluser_local[8] == (chirc_channeluser_t *)0x0) {
      ((*channeluser)->hh_from_user).next = (void *)0x0;
      ((*channeluser)->hh_from_user).prev = (void *)0x0;
      pUVar8 = (UT_hash_table *)malloc(0x40);
      ((*channeluser)->hh_from_user).tbl = pUVar8;
      if (((*channeluser)->hh_from_user).tbl == (UT_hash_table *)0x0) {
        exit(-1);
      }
      memset(((*channeluser)->hh_from_user).tbl,0,0x40);
      (((*channeluser)->hh_from_user).tbl)->tail = &(*channeluser)->hh_from_user;
      (((*channeluser)->hh_from_user).tbl)->num_buckets = 0x20;
      (((*channeluser)->hh_from_user).tbl)->log2_num_buckets = 5;
      (((*channeluser)->hh_from_user).tbl)->hho = (long)*channeluser + (0x20 - (long)*channeluser);
      pUVar9 = (UT_hash_bucket *)malloc(0x200);
      (((*channeluser)->hh_from_user).tbl)->buckets = pUVar9;
      (((*channeluser)->hh_from_user).tbl)->signature = 0xa0111fe1;
      if ((((*channeluser)->hh_from_user).tbl)->buckets == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset((((*channeluser)->hh_from_user).tbl)->buckets,0,0x200);
      channeluser_local[8] = *channeluser;
    }
    else {
      ((*channeluser)->hh_from_user).tbl = (channeluser_local[8]->hh_from_user).tbl;
      ((*channeluser)->hh_from_user).next = (void *)0x0;
      ((*channeluser)->hh_from_user).prev =
           (void *)((long)((channeluser_local[8]->hh_from_user).tbl)->tail -
                   ((channeluser_local[8]->hh_from_user).tbl)->hho);
      ((channeluser_local[8]->hh_from_user).tbl)->tail->next = *channeluser;
      ((channeluser_local[8]->hh_from_user).tbl)->tail = &(*channeluser)->hh_from_user;
    }
    pUVar8 = (channeluser_local[8]->hh_from_user).tbl;
    pUVar8->num_items = pUVar8->num_items + 1;
    pUVar9 = ((channeluser_local[8]->hh_from_user).tbl)->buckets +
             (uVar4 & ((channeluser_local[8]->hh_from_user).tbl)->num_buckets - 1);
    pUVar9->count = pUVar9->count + 1;
    ((*channeluser)->hh_from_user).hh_next = pUVar9->hh_head;
    ((*channeluser)->hh_from_user).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar9->hh_head != (UT_hash_handle *)0x0) {
      pUVar9->hh_head->hh_prev = &(*channeluser)->hh_from_user;
    }
    pUVar9->hh_head = &(*channeluser)->hh_from_user;
    if (((pUVar9->expand_mult + 1) * 10 <= pUVar9->count) &&
       ((((*channeluser)->hh_from_user).tbl)->noexpand == 0)) {
      pUVar9 = (UT_hash_bucket *)
               malloc((ulong)(((*channeluser)->hh_from_user).tbl)->num_buckets << 5);
      if (pUVar9 == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset(pUVar9,0,(ulong)(((*channeluser)->hh_from_user).tbl)->num_buckets << 5);
      (((*channeluser)->hh_from_user).tbl)->ideal_chain_maxlen =
           ((((*channeluser)->hh_from_user).tbl)->num_items >>
           ((char)(((*channeluser)->hh_from_user).tbl)->log2_num_buckets + 1U & 0x1f)) +
           (uint)(((((*channeluser)->hh_from_user).tbl)->num_items &
                  (((*channeluser)->hh_from_user).tbl)->num_buckets * 2 - 1) != 0);
      (((*channeluser)->hh_from_user).tbl)->nonideal_items = 0;
      for (_he_thh._0_4_ = 0; (uint)_he_thh < (((*channeluser)->hh_from_user).tbl)->num_buckets;
          _he_thh._0_4_ = (uint)_he_thh + 1) {
        _he_hh_nxt = (((*channeluser)->hh_from_user).tbl)->buckets[(uint)_he_thh].hh_head;
        while (_he_hh_nxt != (UT_hash_handle *)0x0) {
          pUVar1 = _he_hh_nxt->hh_next;
          pUVar10 = pUVar9 + (_he_hh_nxt->hashv &
                             (((*channeluser)->hh_from_user).tbl)->num_buckets * 2 - 1);
          uVar4 = pUVar10->count + 1;
          pUVar10->count = uVar4;
          if (((((*channeluser)->hh_from_user).tbl)->ideal_chain_maxlen < uVar4) &&
             (pUVar8 = ((*channeluser)->hh_from_user).tbl,
             pUVar8->nonideal_items = pUVar8->nonideal_items + 1,
             pUVar10->expand_mult * (((*channeluser)->hh_from_user).tbl)->ideal_chain_maxlen <
             pUVar10->count)) {
            pUVar10->expand_mult = pUVar10->expand_mult + 1;
          }
          _he_hh_nxt->hh_prev = (UT_hash_handle *)0x0;
          _he_hh_nxt->hh_next = pUVar10->hh_head;
          if (pUVar10->hh_head != (UT_hash_handle *)0x0) {
            pUVar10->hh_head->hh_prev = _he_hh_nxt;
          }
          pUVar10->hh_head = _he_hh_nxt;
          _he_hh_nxt = pUVar1;
        }
      }
      free((((*channeluser)->hh_from_user).tbl)->buckets);
      pUVar8 = ((*channeluser)->hh_from_user).tbl;
      pUVar8->num_buckets = pUVar8->num_buckets << 1;
      pUVar8 = ((*channeluser)->hh_from_user).tbl;
      pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
      (((*channeluser)->hh_from_user).tbl)->buckets = pUVar9;
      if ((((*channeluser)->hh_from_user).tbl)->num_items >> 1 <
          (((*channeluser)->hh_from_user).tbl)->nonideal_items) {
        local_fc = (((*channeluser)->hh_from_user).tbl)->ineff_expands + 1;
      }
      else {
        local_fc = 0;
      }
      (((*channeluser)->hh_from_user).tbl)->ineff_expands = local_fc;
      if (1 < (((*channeluser)->hh_from_user).tbl)->ineff_expands) {
        (((*channeluser)->hh_from_user).tbl)->noexpand = 1;
      }
    }
    pcStack_b0 = *channeluser;
    _hj_j_2 = 0xfeedbeef;
    _hj_key_2._4_4_ = 0x9e3779b9;
    _hj_k_2 = 0x9e3779b9;
    for (_hj_key_2._0_4_ = 8; 0xb < (uint)_hj_key_2; _hj_key_2._0_4_ = (uint)_hj_key_2 - 0xc) {
      iVar3 = (uint)*(byte *)((long)&pcStack_b0->user + 4) +
              (uint)*(byte *)((long)&pcStack_b0->user + 5) * 0x100 +
              (uint)*(byte *)((long)&pcStack_b0->user + 6) * 0x10000 +
              (uint)*(byte *)((long)&pcStack_b0->user + 7) * 0x1000000 + _hj_key_2._4_4_;
      uVar4 = (uint)*(byte *)&pcStack_b0->channel +
              (uint)*(byte *)((long)&pcStack_b0->channel + 1) * 0x100 +
              (uint)*(byte *)((long)&pcStack_b0->channel + 2) * 0x10000 +
              (uint)*(byte *)((long)&pcStack_b0->channel + 3) * 0x1000000 + _hj_j_2;
      uVar5 = uVar4 >> 0xd ^
              (((uint)*(byte *)&pcStack_b0->user +
                (uint)*(byte *)((long)&pcStack_b0->user + 1) * 0x100 +
                (uint)*(byte *)((long)&pcStack_b0->user + 2) * 0x10000 +
                (uint)*(byte *)((long)&pcStack_b0->user + 3) * 0x1000000 + _hj_k_2) - iVar3) - uVar4
      ;
      uVar6 = uVar5 << 8 ^ (iVar3 - uVar4) - uVar5;
      uVar4 = uVar6 >> 0xd ^ (uVar4 - uVar5) - uVar6;
      uVar5 = uVar4 >> 0xc ^ (uVar5 - uVar6) - uVar4;
      uVar6 = uVar5 << 0x10 ^ (uVar6 - uVar4) - uVar5;
      uVar4 = uVar6 >> 5 ^ (uVar4 - uVar5) - uVar6;
      _hj_k_2 = uVar4 >> 3 ^ (uVar5 - uVar6) - uVar4;
      _hj_key_2._4_4_ = _hj_k_2 << 10 ^ (uVar6 - uVar4) - _hj_k_2;
      _hj_j_2 = _hj_key_2._4_4_ >> 0xf ^ (uVar4 - _hj_k_2) - _hj_key_2._4_4_;
      pcStack_b0 = (chirc_channeluser_t *)((long)&pcStack_b0->channel + 4);
    }
    uVar4 = _hj_j_2 + 8;
    switch((uint)_hj_key_2) {
    case 8:
      _hj_key_2._4_4_ =
           (uint)*(byte *)((long)&pcStack_b0->user + 4) +
           (uint)*(byte *)((long)&pcStack_b0->user + 5) * 0x100 +
           (uint)*(byte *)((long)&pcStack_b0->user + 6) * 0x10000 +
           (uint)*(byte *)((long)&pcStack_b0->user + 7) * 0x1000000 + _hj_key_2._4_4_;
    case 4:
      _hj_k_2 = (uint)*(byte *)&pcStack_b0->user +
                (uint)*(byte *)((long)&pcStack_b0->user + 1) * 0x100 +
                (uint)*(byte *)((long)&pcStack_b0->user + 2) * 0x10000 +
                (uint)*(byte *)((long)&pcStack_b0->user + 3) * 0x1000000 + _hj_k_2;
    }
    uVar5 = uVar4 >> 0xd ^ (_hj_k_2 - _hj_key_2._4_4_) - uVar4;
    uVar6 = uVar5 << 8 ^ (_hj_key_2._4_4_ - uVar4) - uVar5;
    uVar4 = uVar6 >> 0xd ^ (uVar4 - uVar5) - uVar6;
    uVar5 = uVar4 >> 0xc ^ (uVar5 - uVar6) - uVar4;
    uVar6 = uVar5 << 0x10 ^ (uVar6 - uVar4) - uVar5;
    uVar4 = uVar6 >> 5 ^ (uVar4 - uVar5) - uVar6;
    uVar5 = uVar4 >> 3 ^ (uVar5 - uVar6) - uVar4;
    uVar6 = uVar5 << 10 ^ (uVar6 - uVar4) - uVar5;
    uVar4 = uVar6 >> 0xf ^ (uVar4 - uVar5) - uVar6;
    ((*channeluser)->hh_from_channel).hashv = uVar4;
    ((*channeluser)->hh_from_channel).key = *channeluser;
    ((*channeluser)->hh_from_channel).keylen = 8;
    lVar2._0_1_ = user_local->registered;
    lVar2._1_1_ = user_local->modes[0];
    lVar2._2_1_ = user_local->modes[1];
    lVar2._3_1_ = user_local->modes[2];
    lVar2._4_1_ = user_local->modes[3];
    lVar2._5_1_ = user_local->modes[4];
    lVar2._6_1_ = user_local->modes[5];
    lVar2._7_1_ = user_local->modes[6];
    if (lVar2 == 0) {
      ((*channeluser)->hh_from_channel).next = (void *)0x0;
      ((*channeluser)->hh_from_channel).prev = (void *)0x0;
      pUVar8 = (UT_hash_table *)malloc(0x40);
      ((*channeluser)->hh_from_channel).tbl = pUVar8;
      if (((*channeluser)->hh_from_channel).tbl == (UT_hash_table *)0x0) {
        exit(-1);
      }
      memset(((*channeluser)->hh_from_channel).tbl,0,0x40);
      (((*channeluser)->hh_from_channel).tbl)->tail = &(*channeluser)->hh_from_channel;
      (((*channeluser)->hh_from_channel).tbl)->num_buckets = 0x20;
      (((*channeluser)->hh_from_channel).tbl)->log2_num_buckets = 5;
      (((*channeluser)->hh_from_channel).tbl)->hho =
           (long)*channeluser + (0x58 - (long)*channeluser);
      pUVar9 = (UT_hash_bucket *)malloc(0x200);
      (((*channeluser)->hh_from_channel).tbl)->buckets = pUVar9;
      (((*channeluser)->hh_from_channel).tbl)->signature = 0xa0111fe1;
      if ((((*channeluser)->hh_from_channel).tbl)->buckets == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset((((*channeluser)->hh_from_channel).tbl)->buckets,0,0x200);
      *(chirc_channeluser_t **)&user_local->registered = *channeluser;
    }
    else {
      ((*channeluser)->hh_from_channel).tbl =
           *(UT_hash_table **)(*(long *)&user_local->registered + 0x58);
      ((*channeluser)->hh_from_channel).next = (void *)0x0;
      ((*channeluser)->hh_from_channel).prev =
           (void *)(*(long *)(*(long *)(*(long *)&user_local->registered + 0x58) + 0x18) -
                   *(long *)(*(long *)(*(long *)&user_local->registered + 0x58) + 0x20));
      *(chirc_channeluser_t **)
       (*(long *)(*(long *)(*(long *)&user_local->registered + 0x58) + 0x18) + 0x10) = *channeluser;
      *(UT_hash_handle **)(*(long *)(*(long *)&user_local->registered + 0x58) + 0x18) =
           &(*channeluser)->hh_from_channel;
    }
    lVar2 = *(long *)(*(long *)&user_local->registered + 0x58);
    *(int *)(lVar2 + 0x10) = *(int *)(lVar2 + 0x10) + 1;
    plVar11 = (long *)(**(long **)(*(long *)&user_local->registered + 0x58) +
                      (ulong)(uVar4 & *(int *)(*(long *)(*(long *)&user_local->registered + 0x58) +
                                              8) - 1U) * 0x10);
    *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
    ((*channeluser)->hh_from_channel).hh_next = (UT_hash_handle *)*plVar11;
    ((*channeluser)->hh_from_channel).hh_prev = (UT_hash_handle *)0x0;
    if (*plVar11 != 0) {
      *(UT_hash_handle **)(*plVar11 + 0x18) = &(*channeluser)->hh_from_channel;
    }
    *plVar11 = (long)&(*channeluser)->hh_from_channel;
    if (((uint)((*(int *)((long)plVar11 + 0xc) + 1) * 10) <= *(uint *)(plVar11 + 1)) &&
       ((((*channeluser)->hh_from_channel).tbl)->noexpand == 0)) {
      pUVar9 = (UT_hash_bucket *)
               malloc((ulong)(((*channeluser)->hh_from_channel).tbl)->num_buckets << 5);
      if (pUVar9 == (UT_hash_bucket *)0x0) {
        exit(-1);
      }
      memset(pUVar9,0,(ulong)(((*channeluser)->hh_from_channel).tbl)->num_buckets << 5);
      (((*channeluser)->hh_from_channel).tbl)->ideal_chain_maxlen =
           ((((*channeluser)->hh_from_channel).tbl)->num_items >>
           ((char)(((*channeluser)->hh_from_channel).tbl)->log2_num_buckets + 1U & 0x1f)) +
           (uint)(((((*channeluser)->hh_from_channel).tbl)->num_items &
                  (((*channeluser)->hh_from_channel).tbl)->num_buckets * 2 - 1) != 0);
      (((*channeluser)->hh_from_channel).tbl)->nonideal_items = 0;
      for (_he_thh_1._0_4_ = 0;
          (uint)_he_thh_1 < (((*channeluser)->hh_from_channel).tbl)->num_buckets;
          _he_thh_1._0_4_ = (uint)_he_thh_1 + 1) {
        _he_hh_nxt_1 = (((*channeluser)->hh_from_channel).tbl)->buckets[(uint)_he_thh_1].hh_head;
        while (_he_hh_nxt_1 != (UT_hash_handle *)0x0) {
          pUVar1 = _he_hh_nxt_1->hh_next;
          pUVar10 = pUVar9 + (_he_hh_nxt_1->hashv &
                             (((*channeluser)->hh_from_channel).tbl)->num_buckets * 2 - 1);
          uVar4 = pUVar10->count + 1;
          pUVar10->count = uVar4;
          if (((((*channeluser)->hh_from_channel).tbl)->ideal_chain_maxlen < uVar4) &&
             (pUVar8 = ((*channeluser)->hh_from_channel).tbl,
             pUVar8->nonideal_items = pUVar8->nonideal_items + 1,
             pUVar10->expand_mult * (((*channeluser)->hh_from_channel).tbl)->ideal_chain_maxlen <
             pUVar10->count)) {
            pUVar10->expand_mult = pUVar10->expand_mult + 1;
          }
          _he_hh_nxt_1->hh_prev = (UT_hash_handle *)0x0;
          _he_hh_nxt_1->hh_next = pUVar10->hh_head;
          if (pUVar10->hh_head != (UT_hash_handle *)0x0) {
            pUVar10->hh_head->hh_prev = _he_hh_nxt_1;
          }
          pUVar10->hh_head = _he_hh_nxt_1;
          _he_hh_nxt_1 = pUVar1;
        }
      }
      free((((*channeluser)->hh_from_channel).tbl)->buckets);
      pUVar8 = ((*channeluser)->hh_from_channel).tbl;
      pUVar8->num_buckets = pUVar8->num_buckets << 1;
      pUVar8 = ((*channeluser)->hh_from_channel).tbl;
      pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
      (((*channeluser)->hh_from_channel).tbl)->buckets = pUVar9;
      if ((((*channeluser)->hh_from_channel).tbl)->num_items >> 1 <
          (((*channeluser)->hh_from_channel).tbl)->nonideal_items) {
        local_10c = (((*channeluser)->hh_from_channel).tbl)->ineff_expands + 1;
      }
      else {
        local_10c = 0;
      }
      (((*channeluser)->hh_from_channel).tbl)->ineff_expands = local_10c;
      if (1 < (((*channeluser)->hh_from_channel).tbl)->ineff_expands) {
        (((*channeluser)->hh_from_channel).tbl)->noexpand = 1;
      }
    }
  }
  else {
    _hj_i._3_1_ = false;
  }
  return _hj_i._3_1_;
}

Assistant:

bool chirc_channeluser_get_or_create(chirc_channel_t *channel, chirc_user_t *user, chirc_channeluser_t **channeluser)
{
    bool created;

    HASH_FIND(hh_from_channel,channel->users, &user,sizeof(chirc_user_t *), *channeluser);
    if(*channeluser)
    {
        created = false;
    }
    else
    {
        created = true;

        *channeluser = malloc(sizeof(chirc_channeluser_t));
        chirc_channeluser_init(*channeluser);
        (*channeluser)->channel = channel;
        (*channeluser)->user = user;
        HASH_ADD(hh_from_user, user->channels, channel, sizeof(chirc_channel_t *), *channeluser);
        HASH_ADD(hh_from_channel, channel->users, user, sizeof(chirc_user_t *), *channeluser);
    }

    return created;
}